

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O0

void __thiscall ipx::SparseMatrix::SortIndices(SparseMatrix *this)

{
  double dVar1;
  int iVar2;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  end;
  bool bVar3;
  Int IVar4;
  int *piVar5;
  reference pvVar6;
  double *pdVar7;
  int __c;
  int __c_00;
  SparseMatrix *in_RDI;
  Int p_1;
  Int k;
  Int p;
  Int nz;
  Int j;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> work;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffff18;
  SparseMatrix *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint uVar8;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint local_60;
  int local_5c;
  uint local_40;
  int local_3c;
  int local_38;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_20;
  
  bVar3 = IsSorted((SparseMatrix *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (!bVar3) {
    rows(in_RDI);
    std::allocator<std::pair<int,_double>_>::allocator
              ((allocator<std::pair<int,_double>_> *)0x84cd35);
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
               (allocator_type *)in_stack_ffffffffffffff30._M_current);
    std::allocator<std::pair<int,_double>_>::~allocator
              ((allocator<std::pair<int,_double>_> *)0x84cd5b);
    for (local_38 = 0; IVar4 = cols((SparseMatrix *)0x84cd7e), local_38 < IVar4;
        local_38 = local_38 + 1) {
      local_3c = 0;
      for (local_40 = begin(in_stack_ffffffffffffff20,
                            (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
          IVar4 = SparseMatrix::end(in_stack_ffffffffffffff20,
                                    (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20)),
          (int)local_40 < IVar4; local_40 = local_40 + 1) {
        piVar5 = (int *)index(in_RDI,(char *)(ulong)local_40,__c);
        iVar2 = *piVar5;
        pvVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](&local_20,(long)local_3c);
        pvVar6->first = iVar2;
        pdVar7 = value(in_stack_ffffffffffffff20,(Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        dVar1 = *pdVar7;
        pvVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](&local_20,(long)local_3c);
        pvVar6->second = dVar1;
        local_3c = local_3c + 1;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                (in_stack_ffffffffffffff18);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                (in_stack_ffffffffffffff18);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
      ::operator+((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                  (difference_type)in_stack_ffffffffffffff20);
      end._M_current._4_4_ = in_stack_ffffffffffffff2c;
      end._M_current._0_4_ = in_stack_ffffffffffffff28;
      pdqsort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>>
                (in_stack_ffffffffffffff30,end);
      local_5c = 0;
      local_60 = begin(in_stack_ffffffffffffff20,(Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
      while (uVar8 = local_60,
            IVar4 = SparseMatrix::end(in_stack_ffffffffffffff20,
                                      (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20)),
            (int)uVar8 < IVar4) {
        pvVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](&local_20,(long)local_5c);
        in_stack_ffffffffffffff2c = pvVar6->first;
        in_stack_ffffffffffffff30._M_current =
             (pair<int,_double> *)index(in_RDI,(char *)(ulong)local_60,__c_00);
        (in_stack_ffffffffffffff30._M_current)->first = in_stack_ffffffffffffff2c;
        pvVar6 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[](&local_20,(long)local_5c);
        in_stack_ffffffffffffff18 =
             (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
             pvVar6->second;
        in_stack_ffffffffffffff20 =
             (SparseMatrix *)
             value(in_stack_ffffffffffffff20,(Int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
        *(vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> **)
         in_stack_ffffffffffffff20 = in_stack_ffffffffffffff18;
        local_5c = local_5c + 1;
        local_60 = local_60 + 1;
      }
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
              ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
               in_stack_ffffffffffffff30._M_current);
  }
  return;
}

Assistant:

void SparseMatrix::SortIndices() {
    if (IsSorted())
        return;
    std::vector<std::pair<Int,double>> work(rows());
    for (Int j = 0; j < cols(); j++) {
        Int nz = 0;             // # entries in column j
        for (Int p = begin(j); p < end(j); p++) {
            work[nz].first = index(p);
            work[nz].second = value(p);
            nz++;
        }
        pdqsort(work.begin(), work.begin() + nz);
        for (Int k = 0, p = begin(j); p < end(j); k++, p++) {
            index(p) = work[k].first;
            value(p) = work[k].second;
        }
    }
}